

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

DynamicType * __thiscall
Js::PathTypeHandlerBase::PromoteType<false>
          (PathTypeHandlerBase *this,DynamicType *predecessorType,PathTypeSuccessorKey key,
          bool shareType,ScriptContext *scriptContext,DynamicObject *instance,
          PropertyIndex *propertyIndex)

{
  byte bVar1;
  JavascriptLibrary *pJVar2;
  Data *pDVar3;
  TypePath *pTVar4;
  RecyclerWeakReference<Js::DynamicObject> *pRVar5;
  code *pcVar6;
  Recycler *recycler;
  PathTypeSuccessorKey successorKey;
  PathTypeSetterSlotIndex *oldSetters;
  PropertyRecord *propertyKey;
  ScriptContext *pSVar7;
  DynamicType *pDVar8;
  bool bVar9;
  bool bVar10;
  PropertyTypes PVar11;
  PropertyIndex PVar12;
  int iVar13;
  undefined4 *puVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PathTypeHandlerBase *pPVar15;
  PathTypeHandlerWithAttr *this_00;
  DynamicType *pDVar16;
  RecyclerWeakReference<Js::DynamicType> *pRVar17;
  undefined7 in_register_00000009;
  uint uVar18;
  ushort uVar19;
  uint uVar20;
  char16_t *this_01;
  ObjectSlotAttributes *oldAttributes;
  uint16 inlineSlotCapacity;
  PathTypeHandlerBase *pPVar21;
  char *instance_00;
  uint16 offsetOfInlineSlots;
  char cVar22;
  byte bVar23;
  ObjectSlotAttributes OVar24;
  ulong uVar25;
  RecyclerWeakReference<Js::DynamicType> *local_d0;
  RecyclerWeakReference<Js::DynamicType> *nextTypeWeakRef;
  RecyclerWeakReference<Js::DynamicObject> *local_c0;
  ulong local_b8;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> local_b0;
  DynamicObject *local_a8;
  Recycler *local_a0;
  PathTypeSuccessorKey local_98;
  PathTypeSetterSlotIndex *local_90;
  DynamicType *local_88;
  PropertyRecord *local_80;
  ulong local_78;
  undefined4 local_6c;
  PathTypeSetterSlotIndex *local_68;
  undefined8 local_60;
  ScriptContext *local_58;
  ObjectSlotAttributes *local_50;
  PathTypeHandlerBase *local_48;
  DynamicType *local_40;
  uint local_34;
  undefined4 extraout_var_03;
  
  local_58 = scriptContext;
  local_48 = this;
  if (propertyIndex == (PropertyIndex *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x7d1,"(propertyIndex != nullptr)","propertyIndex != nullptr");
    if (!bVar9) goto LAB_00c501e1;
    *puVar14 = 0;
  }
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x7d2,"(isObjectLiteral || instance != nullptr)",
                                "isObjectLiteral || instance != nullptr");
    if (!bVar9) goto LAB_00c501e1;
    *puVar14 = 0;
  }
  local_6c = (undefined4)CONCAT71(in_register_00000009,shareType);
  uVar25 = (ulong)key >> 0x20;
  pJVar2 = (local_58->super_ScriptContextBase).javascriptLibrary;
  local_a0 = local_58->recycler;
  local_d0 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
  local_a8 = instance;
  local_80 = ScriptContext::GetPropertyName(local_58,key.propertyId);
  local_98 = key;
  bVar9 = GetSuccessor(local_48,key,&local_d0);
  pPVar21 = local_48;
  nextTypeWeakRef = (RecyclerWeakReference<Js::DynamicType> *)pJVar2;
  if ((bVar9) &&
     (local_40 = (DynamicType *)(local_d0->super_RecyclerWeakReferenceBase).strongRef,
     local_40 != (DynamicType *)0x0)) {
    local_58->cacheCount = local_58->cacheCount + 1;
    this_00 = (PathTypeHandlerWithAttr *)(local_40->typeHandler).ptr;
    if (((this_00->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
         propertyTypes & 0x40) >> 6 !=
        ((local_48->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x8c3,
                                  "(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked())"
                                  ,
                                  "nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked()"
                                 );
      if (!bVar9) goto LAB_00c501e1;
      *puVar14 = 0;
    }
    local_34 = (*(this_00->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                 super_DynamicTypeHandler._vptr_DynamicTypeHandler[0xc])(this_00,local_80);
    bVar23 = (this_00->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
             super_DynamicTypeHandler.flags;
    if (((DAT_0145c381 != 1) || ((bVar23 & 8) == 0)) &&
       (((bVar23 & 0x10) == 0 || (local_40->isShared == false)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x8c8,
                                  "((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()))"
                                  ,
                                  "(FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared())"
                                 );
      if (!bVar9) goto LAB_00c501e1;
      *puVar14 = 0;
    }
    pSVar7 = local_58;
    if (((DAT_0145c381 & 1) != 0) && (local_40->isShared == false)) {
      if (((this_00->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler
           .flags & 0x10) == 0) {
        AddBlankFieldAt((PathTypeHandlerBase *)this_00,local_80->pid,(PropertyIndex)local_34,
                        local_58);
        DoShareTypeHandlerInternal<true>((PathTypeHandlerBase *)this_00,pSVar7);
      }
      DynamicType::ShareType(local_40);
    }
  }
  else {
    local_40 = (DynamicType *)(local_48->typePath).ptr;
    bVar23 = *(byte *)(*(long *)&local_40->super_Type + 0x22);
    local_88 = predecessorType;
    local_78 = uVar25;
    iVar13 = (*(local_48->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(local_48);
    local_50 = (ObjectSlotAttributes *)CONCAT44(extraout_var,iVar13);
    iVar13 = (*(pPVar21->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(pPVar21);
    pPVar15 = local_48;
    local_90 = (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_00,iVar13);
    pDVar3 = (((pPVar21->typePath).ptr)->data).ptr;
    bVar1 = pDVar3->pathLength;
    uVar19 = (pPVar21->super_DynamicTypeHandler).unusedBytes >> 1;
    if (uVar19 < bVar1) {
      this_01 = L"branching";
      local_60 = (ObjectSlotAttributes *)((ulong)local_60._4_4_ << 0x20);
    }
    else {
      local_60 = (ObjectSlotAttributes *)
                 CONCAT44(local_60._4_4_,
                          (int)CONCAT71((int7)((ulong)pDVar3 >> 8),bVar1 == pDVar3->pathSize));
      this_01 = L"advancing";
    }
    local_c0 = GetSingletonInstance(local_48);
    TraceFixedFieldsBeforeTypeHandlerChange
              (this_01,L"PathTypeHandler",L"PathTypeHandler",local_a8,
               &pPVar15->super_DynamicTypeHandler,local_88,local_c0);
    pPVar21 = local_48;
    oldAttributes = local_50;
    oldSetters = local_90;
    recycler = local_a0;
    local_34 = (uint)bVar23;
    cVar22 = (char)local_78;
    if (uVar19 < bVar1) {
      uVar18 = (uint)((pPVar15->super_DynamicTypeHandler).unusedBytes >> 1);
      bVar9 = (bool)((DAT_0145c365 ^ 1) & ((pPVar15->super_DynamicTypeHandler).flags & 0x18) != 0);
      pPVar21 = (PathTypeHandlerBase *)(pPVar15->typePath).ptr;
      if (local_90 == (PathTypeSetterSlotIndex *)0x0) {
        local_40 = (DynamicType *)
                   TypePath::Branch<false>
                             ((TypePath *)pPVar21,local_a0,uVar18,bVar9,(ObjectSlotAttributes *)0x0)
        ;
        oldAttributes = local_50;
      }
      else {
        local_40 = (DynamicType *)
                   TypePath::Branch<true>((TypePath *)pPVar21,local_a0,uVar18,bVar9,local_50);
      }
      local_58->branchCount = local_58->branchCount + 1;
      if (cVar22 == '\a' && oldAttributes == (ObjectSlotAttributes *)0x0) {
        local_60 = (ObjectSlotAttributes *)0x0;
      }
      else {
        local_60 = UpdateAttributes(pPVar21,recycler,oldAttributes,(uint8)local_34,
                                    (*(Data **)&local_40->super_Type)->pathSize);
      }
      if (cVar22 == -9 || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
        local_68 = UpdateSetterSlots(pPVar15,recycler,oldSetters,(uint8)local_34,
                                     (*(Data **)&local_40->super_Type)->pathSize);
      }
      else {
        local_68 = (PathTypeSetterSlotIndex *)0x0;
      }
      pPVar21 = pPVar15;
      if (DAT_0145c381 == 1) {
        bVar9 = HasSingletonInstanceOnlyIfNeeded(pPVar15);
        if (!bVar9) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar14 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x816,"(this->HasSingletonInstanceOnlyIfNeeded())",
                                      "this->HasSingletonInstanceOnlyIfNeeded()");
          if (!bVar9) goto LAB_00c501e1;
          *puVar14 = 0;
        }
        pTVar4 = (pPVar15->typePath).ptr;
        pRVar5 = (pTVar4->singletonInstance).ptr;
        if ((pRVar5 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
           ((DynamicObject *)(pRVar5->super_RecyclerWeakReferenceBase).strongRef == local_a8)) {
          (pTVar4->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
        }
      }
LAB_00c4fb83:
      if (cVar22 == -9) goto LAB_00c4fb8d;
      local_34 = TypePath::AddInternal<true>((TypePath *)local_40,local_80);
      local_90 = (PathTypeSetterSlotIndex *)((ulong)local_90 & 0xffffffff00000000);
    }
    else {
      if ((char)local_60 != '\0') {
        pPVar15 = (PathTypeHandlerBase *)(local_48->typePath).ptr;
        local_40 = (DynamicType *)TypePath::Grow((TypePath *)pPVar15,local_a0);
        if (cVar22 == '\a' && local_50 == (ObjectSlotAttributes *)0x0) {
          local_60 = (ObjectSlotAttributes *)0x0;
        }
        else {
          local_60 = UpdateAttributes(pPVar15,recycler,local_50,(uint8)local_34,
                                      (*(Data **)&local_40->super_Type)->pathSize);
        }
        if (cVar22 == -9 || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
          local_68 = UpdateSetterSlots(pPVar21,recycler,oldSetters,(uint8)local_34,
                                       (*(Data **)&local_40->super_Type)->pathSize);
        }
        else {
          local_68 = (PathTypeSetterSlotIndex *)0x0;
        }
        pTVar4 = (pPVar21->typePath).ptr;
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        pPVar15 = pPVar21;
        do {
          (*(pPVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6a])(pPVar15,local_40);
          if ((local_50 != (ObjectSlotAttributes *)0x0) &&
             (iVar13 = (*(pPVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])
                                 (pPVar15),
             (ObjectSlotAttributes *)CONCAT44(extraout_var_01,iVar13) == local_50)) {
            (*(pPVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6d])(pPVar15,local_60);
          }
          if ((oldSetters != (PathTypeSetterSlotIndex *)0x0) &&
             (iVar13 = (*(pPVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])
                                 (pPVar15),
             (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_02,iVar13) == oldSetters)) {
            (*(pPVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x72])(pPVar15,local_68);
          }
          pDVar16 = (pPVar15->predecessorType).ptr;
          if (pDVar16 == (DynamicType *)0x0) break;
          iVar13 = (*((pDVar16->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4e])();
          if (iVar13 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar14 = 1;
            bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                        ,0x844,
                                        "(currPredecessorType->GetTypeHandler()->IsPathTypeHandler())"
                                        ,
                                        "currPredecessorType->GetTypeHandler()->IsPathTypeHandler()"
                                       );
            if (!bVar9) goto LAB_00c501e1;
            *puVar14 = 0;
          }
          pPVar15 = FromTypeHandler((pDVar16->typeHandler).ptr);
        } while ((pPVar15->typePath).ptr == pTVar4);
        cVar22 = (char)local_78;
        goto LAB_00c4fb83;
      }
      local_60 = local_50;
      if (local_50 == (ObjectSlotAttributes *)0x0 && cVar22 != '\a') {
        local_60 = UpdateAttributes((PathTypeHandlerBase *)this_01,local_a0,
                                    (ObjectSlotAttributes *)0x0,bVar23,
                                    *(uint8 *)(*(long *)&local_40->super_Type + 0x22));
      }
      pDVar16 = local_40;
      if (oldSetters != (PathTypeSetterSlotIndex *)0x0 || cVar22 != -9) {
        local_68 = oldSetters;
        goto LAB_00c4fb83;
      }
      local_68 = UpdateSetterSlots(pPVar21,recycler,(PathTypeSetterSlotIndex *)0x0,(uint8)local_34,
                                   *(uint8 *)(*(long *)&local_40->super_Type + 0x22));
      local_40 = pDVar16;
LAB_00c4fb8d:
      local_34 = TypePath::AddInternal<false>((TypePath *)local_40,local_80);
      local_90 = (PathTypeSetterSlotIndex *)
                 CONCAT44(local_90._4_4_,(int)CONCAT71((uint7)(uint3)(local_34 >> 8),1));
    }
    uVar20 = ((pPVar21->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    uVar18 = (pPVar21->super_DynamicTypeHandler).slotCapacity;
    uVar19 = (ushort)uVar20;
    if (uVar19 <= (ushort)uVar18) {
      uVar20 = uVar18;
    }
    inlineSlotCapacity = (pPVar21->super_DynamicTypeHandler).inlineSlotCapacity;
    offsetOfInlineSlots = (pPVar21->super_DynamicTypeHandler).offsetOfInlineSlots;
    bVar9 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&pPVar21->super_DynamicTypeHandler)
    ;
    if ((bVar9) &&
       ((pPVar21->super_DynamicTypeHandler).slotCapacity <
        (int)(ObjectSlotAttributes *)((ulong)uVar20 & 0xffff))) {
      PVar12 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      inlineSlotCapacity = inlineSlotCapacity - PVar12;
      offsetOfInlineSlots = 0x20;
    }
    bVar9 = (bool)(DAT_0145c381 ^ 1 | (byte)local_6c);
    OVar24 = (ObjectSlotAttributes)local_78;
    if (local_50 == (ObjectSlotAttributes *)0x0 && OVar24 == ObjectSlotAttr_Default) {
      this_00 = (PathTypeHandlerWithAttr *)
                PathTypeHandlerNoAttr::New
                          (local_58,(TypePath *)local_40,uVar19,(PropertyIndex)uVar20,
                           inlineSlotCapacity,offsetOfInlineSlots,true,bVar9,local_88);
    }
    else {
      local_b8 = (ulong)bVar9;
      local_50 = (ObjectSlotAttributes *)((ulong)uVar20 & 0xffff);
      iVar13 = (*(local_48->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])();
      local_60[(PropertyIndex)local_34] = OVar24;
      this_00 = PathTypeHandlerWithAttr::New
                          (local_58,(TypePath *)local_40,local_60,local_68,
                           (char)iVar13 + (char)local_90,uVar19,(PropertyIndex)local_50,
                           inlineSlotCapacity,offsetOfInlineSlots,true,SUB81(local_b8,0),local_88);
    }
    if (bVar9 == false) {
      DynamicTypeHandler::SetMayBecomeShared((DynamicTypeHandler *)this_00);
    }
    bVar10 = DynamicTypeHandler::GetHasOnlyWritableDataProperties((DynamicTypeHandler *)this_00);
    uVar25 = local_78;
    if (!bVar10) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x87e,"(nextPath->GetHasOnlyWritableDataProperties())",
                                   "nextPath->GetHasOnlyWritableDataProperties()");
      if (!bVar10) goto LAB_00c501e1;
      *puVar14 = 0;
    }
    pPVar21 = local_48;
    PVar11 = DynamicTypeHandler::GetPropertyTypes(&local_48->super_DynamicTypeHandler);
    DynamicTypeHandler::CopyPropertyTypes((DynamicTypeHandler *)this_00,0xb0,PVar11);
    PVar11 = DynamicTypeHandler::GetPropertyTypes(&pPVar21->super_DynamicTypeHandler);
    DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_00,'@',PVar11);
    if ((byte)local_6c != '\0') {
      AddBlankFieldAt((PathTypeHandlerBase *)this_00,local_80->pid,(PropertyIndex)local_34,local_58)
      ;
    }
    if (local_98.propertyId == 0x67) {
      (this_00->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasUserDefinedCtor = true;
    }
    else if ((uint)local_98.propertyId < 0x10) {
      (this_00->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasInternalProperty = true;
    }
    iVar13 = ((local_48->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    if (iVar13 < local_58->maxPathLength) {
      iVar13 = local_58->maxPathLength;
    }
    local_58->maxPathLength = iVar13;
    iVar13 = (*(local_a8->super_RecyclableObject).super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x67])();
    pDVar16 = (DynamicType *)CONCAT44(extraout_var_03,iVar13);
    Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet
              (&(pDVar16->super_Type).prototype,(local_88->super_Type).prototype.ptr);
    Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierSet
              (&pDVar16->typeHandler,(DynamicTypeHandler *)this_00);
    if (bVar9 == false) {
      DynamicType::SetIsLocked(pDVar16);
    }
    else {
      DynamicType::SetIsLockedAndShared(pDVar16);
    }
    pDVar8 = local_40;
    successorKey = local_98;
    pRVar17 = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicType>(local_a0,pDVar16);
    instance_00 = (char *)local_48;
    SetSuccessor(local_48,local_88,successorKey,pRVar17,local_58);
    if ((this_00->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 != (ushort)(*(Data **)&pDVar8->super_Type)->pathLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      instance_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x8aa,
                                  "(nextPath->GetPathLength() == newTypePath->GetPathLength())",
                                  "nextPath->GetPathLength() == newTypePath->GetPathLength()");
      if (!bVar9) goto LAB_00c501e1;
      *puVar14 = 0;
    }
    local_40 = pDVar16;
    if ((DAT_0145c381 == 1 && (byte)local_6c == '\0') &&
       ((this_00->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 <= (ushort)(*(Data **)&pDVar8->super_Type)->maxInitializedLength)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      instance_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x8ac,
                                  "(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength())"
                                  ,
                                  "!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength()"
                                 );
      if (!bVar9) goto LAB_00c501e1;
      *puVar14 = 0;
    }
    TraceFixedFieldsAfterTypeHandlerChange
              ((DynamicObject *)instance_00,&local_48->super_DynamicTypeHandler,
               (DynamicTypeHandler *)this_00,local_88,local_40,local_c0);
    local_58->promoteCount = local_58->promoteCount + 1;
  }
  if ((DAT_0145c365 == 1) &&
     (bVar23 = (local_48->super_DynamicTypeHandler).flags,
     (bVar23 & 0x20) != 0 && (bVar23 & 0x18) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8d5,
                                "(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype())"
                                ,
                                "!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype()"
                               );
    if (!bVar9) goto LAB_00c501e1;
    *puVar14 = 0;
  }
  pPVar21 = local_48;
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)this_00,(local_48->super_DynamicTypeHandler).flags & 0x20);
  bVar9 = DynamicTypeHandler::GetHasOnlyWritableDataProperties(&pPVar21->super_DynamicTypeHandler);
  bVar10 = DynamicTypeHandler::GetHasOnlyWritableDataProperties((DynamicTypeHandler *)this_00);
  bVar23 = (byte)uVar25;
  if ((bVar23 & 0x14) == 4 && bVar10 != bVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8d7,
                                "(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor))"
                                ,
                                "this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor)"
                               );
    if (!bVar9) goto LAB_00c501e1;
    *puVar14 = 0;
  }
  if (((local_48->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6 !=
      ((this_00->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
       propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8d8,
                                "(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar9) goto LAB_00c501e1;
    *puVar14 = 0;
  }
  PVar11 = DynamicTypeHandler::GetPropertyTypes(&local_48->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_00,0xa0,PVar11);
  pRVar17 = nextTypeWeakRef;
  bVar23 = (byte)~bVar23 >> 2 & bVar23 & 4;
  Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::WriteBarrierSet
            ((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)&local_b0,
             (PrototypeChainCache<Js::OnlyWritablePropertyCache> *)
             &nextTypeWeakRef[0xbb].super_RecyclerWeakReferenceBase.strongRefHeapBlock);
  pSVar7 = local_58;
  propertyKey = local_80;
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)local_b0.ptr,
             (DynamicTypeHandler *)this_00,bVar23,local_80,local_58);
  Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
            (&local_b0,
             (PrototypeChainCache<Js::NoSpecialPropertyCache> *)
             &pRVar17[0xbc].super_RecyclerWeakReferenceBase.next);
  PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            (local_b0.ptr,(DynamicTypeHandler *)this_00,bVar23,propertyKey,pSVar7);
  pDVar16 = local_40;
  *propertyIndex = (PropertyIndex)local_34;
  if ((PathTypeHandlerBase *)
      (((this_00->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.predecessorType.ptr)->
      typeHandler).ptr != local_48) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8e2,"(nextPath->GetPredecessorType()->GetTypeHandler() == this)",
                                "Promoting this type to a successor with a different predecessor?");
    if (!bVar9) {
LAB_00c501e1:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar14 = 0;
  }
  return pDVar16;
}

Assistant:

DynamicType* PathTypeHandlerBase::PromoteType(DynamicType* predecessorType, const PathTypeSuccessorKey key, bool shareType, ScriptContext* scriptContext, DynamicObject* instance, PropertyIndex* propertyIndex)
    {
        Assert(propertyIndex != nullptr);
        Assert(isObjectLiteral || instance != nullptr);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        Recycler* recycler = scriptContext->GetRecycler();
        PropertyIndex index;
        DynamicType * nextType;
        RecyclerWeakReference<DynamicType>* nextTypeWeakRef = nullptr;
        const PropertyRecord *propertyRecord = scriptContext->GetPropertyName(key.GetPropertyId());

        PathTypeHandlerBase * nextPath;
        if (!GetSuccessor(key, &nextTypeWeakRef) || (nextType = nextTypeWeakRef->Get()) == nullptr)
        {
            TypePath * newTypePath = GetTypePath();
            uint8 oldPathSize = GetTypePath()->GetPathSize();

            ObjectSlotAttributes *oldAttributes = GetAttributeArray();
            ObjectSlotAttributes *newAttributes = oldAttributes;
            PathTypeSetterSlotIndex *oldSetters = GetSetterSlots();
            PathTypeSetterSlotIndex *newSetters = oldSetters;

            bool branching = GetTypePath()->GetPathLength() > GetPathLength();
            bool growing = !branching && GetTypePath()->GetPathLength() == GetTypePath()->GetPathSize();

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            DynamicType* oldType = predecessorType;
            RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
            TraceFixedFieldsBeforeTypeHandlerChange(branching ? _u("branching") : _u("advancing"), _u("PathTypeHandler"), _u("PathTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif
#endif

            if (branching)
            {
                // We need to branch the type path.

                if (oldSetters)
                {
                    newTypePath = GetTypePath()->Branch<true>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes(), oldAttributes);
                }
                else
                {
                    newTypePath = GetTypePath()->Branch<false>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes());
                }

#ifdef PROFILE_TYPES
                scriptContext->branchCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
                if (isObjectLiteral)
                {
                    scriptContext->objectLiteralBranchCount++;
                }
#endif

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                if (PathTypeHandlerBase::FixPropsOnPathTypes())
                {
                    Assert(this->HasSingletonInstanceOnlyIfNeeded());
                    this->GetTypePath()->ClearSingletonInstanceIfSame(instance);
                }
#endif
#endif
            }
            else if (growing)
            {
                // We need to grow the type path.

                newTypePath = GetTypePath()->Grow(recycler);

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

                // Update all the predecessor types that use this TypePath to the new TypePath.
                // This will allow the old TypePath to be collected, and will ensure that the
                // fixed field info is correct for those types.

                PathTypeHandlerBase * typeHandlerToUpdate = this;
                TypePath * oldTypePath = GetTypePath();
                while (true)
                {
                    typeHandlerToUpdate->SetTypePath(newTypePath);
                    if (oldAttributes && typeHandlerToUpdate->GetAttributeArray() == oldAttributes)
                    {
                        typeHandlerToUpdate->SetAttributeArray(newAttributes);
                    }
                    if (oldSetters && typeHandlerToUpdate->GetSetterSlots() == oldSetters)
                    {
                        typeHandlerToUpdate->SetSetterSlots(newSetters);
                    }

                    DynamicType * currPredecessorType = typeHandlerToUpdate->GetPredecessorType();
                    if (currPredecessorType == nullptr)
                    {
                        break;
                    }

                    Assert(currPredecessorType->GetTypeHandler()->IsPathTypeHandler());
                    typeHandlerToUpdate = PathTypeHandlerBase::FromTypeHandler(currPredecessorType->GetTypeHandler());
                    if (typeHandlerToUpdate->GetTypePath() != oldTypePath)
                    {
                        break;
                    }
                }
            }
            else
            {
                if (key.GetAttributes() != ObjectSlotAttr_Default && oldAttributes == nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) && oldSetters == nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }
            }

            bool isSetterProperty = key.GetAttributes() == ObjectSlotAttr_Setter;
            if (isSetterProperty)
            {
                // Not actually adding a property ID to the type path map here.
                index = (PropertyIndex)newTypePath->AddInternal<false>(propertyRecord);
            }
            else
            {
                index = (PropertyIndex)newTypePath->AddInternal<true>(propertyRecord);
            }

            const PropertyIndex newPropertyCount = GetPathLength() + 1;
            const PropertyIndex newSlotCapacity = max(newPropertyCount, static_cast<PropertyIndex>(GetSlotCapacity()));
            PropertyIndex newInlineSlotCapacity = GetInlineSlotCapacity();
            uint16 newOffsetOfInlineSlots = GetOffsetOfInlineSlots();
            if(IsObjectHeaderInlinedTypeHandler() && newSlotCapacity > GetSlotCapacity())
            {
                newInlineSlotCapacity -= GetObjectHeaderInlinableSlotCapacity();
                newOffsetOfInlineSlots = sizeof(DynamicObject);
            }
#if ENABLE_FIXED_FIELDS
            bool markTypeAsShared = !FixPropsOnPathTypes() || shareType;
#else
            bool markTypeAsShared = true;
#endif

            if (key.GetAttributes() == ObjectSlotAttr_Default && oldAttributes == nullptr)
            {
                nextPath = PathTypeHandlerNoAttr::New(scriptContext, newTypePath, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            else
            {
                PathTypeSetterSlotIndex newSetterCount = GetSetterCount() + isSetterProperty;
                newAttributes[index] = key.GetAttributes();
                nextPath = PathTypeHandlerWithAttr::New(scriptContext, newTypePath, newAttributes, newSetters, newSetterCount, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            if (!markTypeAsShared) nextPath->SetMayBecomeShared();
            Assert(nextPath->GetHasOnlyWritableDataProperties());
            nextPath->CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, GetPropertyTypes());
            nextPath->SetPropertyTypes(PropertyTypesInlineSlotCapacityLocked, GetPropertyTypes());

#if ENABLE_FIXED_FIELDS
            if (shareType)
            {
                nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
            }
#endif

            if (key.GetPropertyId() == PropertyIds::constructor)
            {
                nextPath->hasUserDefinedCtor = true;
            }

            if (IsInternalPropertyId(key.GetPropertyId()))
            {
                nextPath->hasInternalProperty = true;
            }

#ifdef PROFILE_TYPES
            scriptContext->maxPathLength = max(GetPathLength() + 1, scriptContext->maxPathLength);
#endif

            if (isObjectLiteral)
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = RecyclerNew(recycler, DynamicType, predecessorType, nextPath, /* isLocked = */ true, /* isShared = */ markTypeAsShared);
            }
            else
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = instance->DuplicateType();
                // nextType's prototype and predecessorType's prototype can only be different here
                // only for SetPrototype scenario where predecessorType is the cachedType with newPrototype
                nextType->SetPrototype(predecessorType->GetPrototype());
                nextType->typeHandler = nextPath;
                markTypeAsShared ? nextType->SetIsLockedAndShared() : nextType->SetIsLocked();
            }

            SetSuccessor(predecessorType, key, recycler->CreateWeakReferenceHandle<DynamicType>(nextType), scriptContext);
            // We just extended the current type path to a new tip or created a brand new type path.  We should
            // be at the tip of the path and there should be no instances there yet.
            Assert(nextPath->GetPathLength() == newTypePath->GetPathLength());
#if ENABLE_FIXED_FIELDS
            Assert(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength());
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsAfterTypeHandlerChange(instance, this, nextPath, oldType, nextType, oldSingletonInstance);
#endif
#endif
#ifdef PROFILE_TYPES
            scriptContext->promoteCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
            if (isObjectLiteral)
            {
                scriptContext->objectLiteralPromoteCount++;
            }
#endif
        }
        else
        {
#ifdef PROFILE_TYPES
            scriptContext->cacheCount++;
#endif

            // Now that the second (or subsequent) instance reached this type, make sure that it's shared.
            nextPath = (PathTypeHandlerBase *)nextType->GetTypeHandler();
            Assert(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked());

            index = nextPath->GetPropertyIndex(propertyRecord);

#if ENABLE_FIXED_FIELDS
            Assert((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()));
            if (FixPropsOnPathTypes() && !nextType->GetIsShared())
            {
                if (!nextPath->GetIsShared())
                {
                    nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
                    nextPath->DoShareTypeHandlerInternal<true>(scriptContext);
                }
                nextType->ShareType();
            }
#endif
        }

        Assert(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype());
        nextPath->SetFlags(IsPrototypeFlag, this->GetFlags());
        Assert(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor));
        Assert(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked());
        nextPath->SetPropertyTypes(PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());

        PropertyAttributes isWritableAttribute = ((key.GetAttributes() & ObjectSlotAttr_Writable) && !(key.GetAttributes() & ObjectSlotAttr_Accessor)) ? PropertyWritable : PropertyNone;
        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);

        (*propertyIndex) = index;

#if DBG
        AssertMsg(nextPath->GetPredecessorType()->GetTypeHandler() == this, "Promoting this type to a successor with a different predecessor?");
#endif

        return nextType;
    }